

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::RgbaOutputFile::RgbaOutputFile
          (RgbaOutputFile *this,char *name,int width,int height,RgbaChannels rgbaChannels,
          float pixelAspectRatio,V2f *screenWindowCenter,float screenWindowWidth,LineOrder lineOrder
          ,Compression compression,int numThreads)

{
  Data *pDVar1;
  _func_int **pp_Var2;
  undefined8 in_RSI;
  OutputFile *in_RDI;
  uint in_R8D;
  Header *in_R9;
  ToYca *unaff_retaddr;
  RgbaChannels in_stack_0000000c;
  Header *in_stack_00000010;
  Header hd;
  int in_stack_0000017c;
  Header *in_stack_00000180;
  char *in_stack_00000188;
  OutputFile *in_stack_00000190;
  Compression in_stack_ffffffffffffff9c;
  LineOrder in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  V2f *in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  Header *in_stack_ffffffffffffffc0;
  RgbaChannels rgbaChannels_00;
  OutputFile *outputFile;
  
  rgbaChannels_00 = (RgbaChannels)((ulong)in_RSI >> 0x20);
  (in_RDI->super_GenericOutputFile)._vptr_GenericOutputFile =
       (_func_int **)&PTR__RgbaOutputFile_00562070;
  in_RDI->_data = (Data *)0x0;
  in_RDI[1].super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
  outputFile = in_RDI;
  Header::Header(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                 in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                 in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  anon_unknown_1::insertChannels(in_stack_00000010,in_stack_0000000c);
  pDVar1 = (Data *)operator_new(0x10);
  OutputFile::OutputFile(in_stack_00000190,in_stack_00000188,in_stack_00000180,in_stack_0000017c);
  in_RDI->_data = pDVar1;
  if ((in_R8D & 0x30) != 0) {
    pp_Var2 = (_func_int **)operator_new(0x160);
    ToYca::ToYca(unaff_retaddr,outputFile,rgbaChannels_00);
    in_RDI[1].super_GenericOutputFile._vptr_GenericOutputFile = pp_Var2;
  }
  Header::~Header(in_R9);
  return;
}

Assistant:

RgbaOutputFile::RgbaOutputFile (const char name[],
				int width,
				int height,
				RgbaChannels rgbaChannels,
				float pixelAspectRatio,
				const IMATH_NAMESPACE::V2f screenWindowCenter,
				float screenWindowWidth,
				LineOrder lineOrder,
				Compression compression,
                                int numThreads):
    _outputFile (0),
    _toYca (0)
{
    Header hd (width,
	       height,
	       pixelAspectRatio,
	       screenWindowCenter,
	       screenWindowWidth,
	       lineOrder,
	       compression);

    insertChannels (hd, rgbaChannels);
    _outputFile = new OutputFile (name, hd, numThreads);

    if (rgbaChannels & (WRITE_Y | WRITE_C))
	_toYca = new ToYca (*_outputFile, rgbaChannels);
}